

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadMat1_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  pointer pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  short sVar7;
  Logger *pLVar8;
  Texture *pTVar9;
  AutoFacet AVar10;
  StreamReaderLE *pSVar11;
  shared_ptr<Assimp::COB::Texture> *psVar12;
  float fVar13;
  char *local_1e0 [4];
  chunk_guard cn;
  undefined1 local_1a8 [24];
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  aiColor3D local_178;
  float fStack_16c;
  float fStack_168;
  undefined8 uStack_164;
  undefined8 local_15c;
  undefined8 local_154;
  undefined8 uStack_14c;
  undefined8 local_144;
  undefined8 uStack_13c;
  undefined8 local_134;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Mat1");
    return;
  }
  cn.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  local_1a8._16_8_ = &local_188;
  local_1a8._0_8_ = 0;
  local_1a8._8_8_ = 0xffffffff00000000;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_178.r = 0.0;
  local_178.g = 0.0;
  local_178.b = 0.0;
  fStack_16c = 0.0;
  fStack_168 = 0.0;
  uStack_164 = 0;
  local_15c = 0xffffffff3f800000;
  local_154 = 0;
  uStack_14c = 0;
  local_144 = 0;
  uStack_13c = 0;
  local_134 = 0;
  uStack_12c = 0;
  uStack_128 = 0;
  uStack_124 = 0;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cn.nfo = nfo;
  cn.reader = reader;
  std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::
  emplace_back<Assimp::COB::Material>(&out->materials,(Material *)local_1a8);
  COB::Material::~Material((Material *)local_1a8);
  pMVar1 = (out->materials).
           super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar2 = nfo->parent_id;
  uVar3 = nfo->version;
  uVar4 = nfo->size;
  pMVar1[-1].super_ChunkInfo.id = nfo->id;
  pMVar1[-1].super_ChunkInfo.parent_id = uVar2;
  pMVar1[-1].super_ChunkInfo.version = uVar3;
  pMVar1[-1].super_ChunkInfo.size = uVar4;
  sVar7 = StreamReader<false,_false>::Get<short>(reader);
  pMVar1[-1].matnum = (int)sVar7;
  cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
  if (cVar5 != 'f') {
    if (cVar5 == 'm') {
      cVar5 = '\x02';
      goto LAB_00459905;
    }
    if (cVar5 == 'p') {
      cVar5 = '\x01';
      goto LAB_00459905;
    }
    pLVar8 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[50]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [50])"Unrecognized shader type in `Mat1` chunk with id ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &nfo->id);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar8,local_1e0[0]);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  cVar5 = '\0';
LAB_00459905:
  std::__cxx11::string::operator=((string *)&pMVar1[-1].type,cVar5);
  cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
  if (cVar5 == 'a') {
    AVar10 = AUTOFACETED;
  }
  else {
    AVar10 = FACETED;
    if (cVar5 != 'f') {
      if (cVar5 == 's') {
        AVar10 = SMOOTH;
      }
      else {
        pLVar8 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[52]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [52])"Unrecognized faceting mode in `Mat1` chunk with id ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   &nfo->id);
        std::__cxx11::stringbuf::str();
        Logger::error(pLVar8,local_1e0[0]);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      }
    }
  }
  pMVar1[-1].autofacet = AVar10;
  cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
  pMVar1[-1].autofacet_angle = (float)(int)cVar5;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].rgb.r = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].rgb.g = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].rgb.b = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].alpha = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].ka = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].ks = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].exp = fVar13;
  fVar13 = StreamReader<false,_false>::Get<float>(reader);
  pMVar1[-1].ior = fVar13;
  cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
  cVar6 = StreamReader<false,_false>::Get<signed_char>(reader);
  if (cVar6 == ':' && cVar5 == 'e') {
    pTVar9 = (Texture *)operator_new(0x38);
    (pTVar9->transform).mTranslation.x = 0.0;
    (pTVar9->transform).mTranslation.y = 0.0;
    (pTVar9->transform).mScaling.x = 0.0;
    (pTVar9->transform).mScaling.y = 0.0;
    (pTVar9->path).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar9->path).field_2 + 8) = 0;
    (pTVar9->path)._M_dataplus._M_p = (pointer)0x0;
    (pTVar9->path)._M_string_length = 0;
    *(undefined8 *)&(pTVar9->transform).mRotation = 0;
    COB::Texture::Texture(pTVar9);
    std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::COB::Texture>
              (&pMVar1[-1].tex_env.
                super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,pTVar9);
    pSVar11 = reader;
    StreamReader<false,_false>::Get<signed_char>(reader);
    ReadString_Binary((COBImporter *)pSVar11,
                      &(pMVar1[-1].tex_env.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->path,reader);
    cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
    cVar6 = StreamReader<false,_false>::Get<signed_char>(reader);
  }
  if (cVar6 == ':' && cVar5 == 't') {
    pTVar9 = (Texture *)operator_new(0x38);
    psVar12 = &pMVar1[-1].tex_color;
    (pTVar9->transform).mTranslation.x = 0.0;
    (pTVar9->transform).mTranslation.y = 0.0;
    (pTVar9->transform).mScaling.x = 0.0;
    (pTVar9->transform).mScaling.y = 0.0;
    (pTVar9->path).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar9->path).field_2 + 8) = 0;
    (pTVar9->path)._M_dataplus._M_p = (pointer)0x0;
    (pTVar9->path)._M_string_length = 0;
    *(undefined8 *)&(pTVar9->transform).mRotation = 0;
    COB::Texture::Texture(pTVar9);
    std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::COB::Texture>
              (&psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,pTVar9
              );
    pSVar11 = reader;
    StreamReader<false,_false>::Get<signed_char>(reader);
    ReadString_Binary((COBImporter *)pSVar11,
                      &((psVar12->
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       )->path,reader);
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mTranslation.x = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mTranslation.y = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mScaling.x = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mScaling.y = fVar13;
    cVar5 = StreamReader<false,_false>::Get<signed_char>(reader);
    cVar6 = StreamReader<false,_false>::Get<signed_char>(reader);
  }
  if (cVar6 == ':' && cVar5 == 'b') {
    pTVar9 = (Texture *)operator_new(0x38);
    psVar12 = &pMVar1[-1].tex_bump;
    (pTVar9->transform).mTranslation.x = 0.0;
    (pTVar9->transform).mTranslation.y = 0.0;
    (pTVar9->transform).mScaling.x = 0.0;
    (pTVar9->transform).mScaling.y = 0.0;
    (pTVar9->path).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pTVar9->path).field_2 + 8) = 0;
    (pTVar9->path)._M_dataplus._M_p = (pointer)0x0;
    (pTVar9->path)._M_string_length = 0;
    *(undefined8 *)&(pTVar9->transform).mRotation = 0;
    COB::Texture::Texture(pTVar9);
    std::__shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::COB::Texture>
              (&psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>,pTVar9
              );
    pSVar11 = reader;
    StreamReader<false,_false>::Get<signed_char>(reader);
    ReadString_Binary((COBImporter *)pSVar11,
                      &((psVar12->
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       )->path,reader);
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mTranslation.x = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mTranslation.y = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mScaling.x = fVar13;
    fVar13 = StreamReader<false,_false>::Get<float>(reader);
    (((psVar12->super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    transform).mScaling.y = fVar13;
    StreamReader<false,_false>::Get<float>(reader);
  }
  StreamReader<false,_false>::IncPtr(reader,-2);
  chunk_guard::~chunk_guard(&cn);
  return;
}

Assistant:

void COBImporter::ReadMat1_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Binary(reader,nfo,"Mat1");
    }

    const chunk_guard cn(nfo,reader);

    out.materials.push_back(Material());
    Material& mat = out.materials.back();
    mat = nfo;

    mat.matnum = reader.GetI2();
    switch(reader.GetI1()) {
        case 'f':
            mat.type = Material::FLAT;
            break;
        case 'p':
            mat.type = Material::PHONG;
            break;
        case 'm':
            mat.type = Material::METAL;
            break;
        default:
            ASSIMP_LOG_ERROR_F( "Unrecognized shader type in `Mat1` chunk with id ", nfo.id );
            mat.type = Material::FLAT;
    }

    switch(reader.GetI1()) {
        case 'f':
            mat.autofacet = Material::FACETED;
            break;
        case 'a':
            mat.autofacet = Material::AUTOFACETED;
            break;
        case 's':
            mat.autofacet = Material::SMOOTH;
            break;
        default:
            ASSIMP_LOG_ERROR_F( "Unrecognized faceting mode in `Mat1` chunk with id ", nfo.id );
            mat.autofacet = Material::FACETED;
    }
    mat.autofacet_angle = static_cast<float>(reader.GetI1());

    mat.rgb.r = reader.GetF4();
    mat.rgb.g = reader.GetF4();
    mat.rgb.b = reader.GetF4();

    mat.alpha = reader.GetF4();
    mat.ka    = reader.GetF4();
    mat.ks    = reader.GetF4();
    mat.exp   = reader.GetF4();
    mat.ior   = reader.GetF4();

    char id[2];
    id[0] = reader.GetI1(),id[1] = reader.GetI1();

    if (id[0] == 'e' && id[1] == ':') {
        mat.tex_env.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_env->path,reader);

        // advance to next texture-id
        id[0] = reader.GetI1(),id[1] = reader.GetI1();
    }

    if (id[0] == 't' && id[1] == ':') {
        mat.tex_color.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_color->path,reader);

        mat.tex_color->transform.mTranslation.x = reader.GetF4();
        mat.tex_color->transform.mTranslation.y = reader.GetF4();

        mat.tex_color->transform.mScaling.x = reader.GetF4();
        mat.tex_color->transform.mScaling.y = reader.GetF4();

        // advance to next texture-id
        id[0] = reader.GetI1(),id[1] = reader.GetI1();
    }

    if (id[0] == 'b' && id[1] == ':') {
        mat.tex_bump.reset(new Texture());

        reader.GetI1();
        ReadString_Binary(mat.tex_bump->path,reader);

        mat.tex_bump->transform.mTranslation.x = reader.GetF4();
        mat.tex_bump->transform.mTranslation.y = reader.GetF4();

        mat.tex_bump->transform.mScaling.x = reader.GetF4();
        mat.tex_bump->transform.mScaling.y = reader.GetF4();

        // skip amplitude for I don't know its purpose.
        reader.GetF4();
    }
    reader.IncPtr(-2);
}